

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

void __thiscall FScanner::RestorePos(FScanner *this,SavedPos *pos)

{
  SavedPos *pos_local;
  FScanner *this_local;
  
  if (pos->SavedScriptPtr == (char *)0x0) {
    this->End = true;
  }
  else {
    this->ScriptPtr = pos->SavedScriptPtr;
    this->Line = pos->SavedScriptLine;
    this->End = false;
  }
  this->AlreadyGot = false;
  this->LastGotToken = false;
  this->Crossed = false;
  return;
}

Assistant:

void FScanner::RestorePos (const FScanner::SavedPos &pos)
{
	if (pos.SavedScriptPtr)
	{
		ScriptPtr = pos.SavedScriptPtr;
		Line = pos.SavedScriptLine;
		End = false;
	}
	else
	{
		End = true;
	}
	AlreadyGot = false;
	LastGotToken = false;
	Crossed = false;
}